

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall
imrt::EvaluationFunction::EvaluationFunction
          (EvaluationFunction *this,vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,
          Collimator *collimator)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pVVar3;
  pointer pVVar4;
  const_iterator cVar5;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *pvVar6;
  value_type_conflict1 *__val;
  long lVar7;
  size_type __n;
  pointer pdVar8;
  long lVar9;
  allocator_type local_79;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_68;
  value_type local_60;
  vector<int,_std::allocator<int>_> *local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  Collimator *local_38;
  
  this->_vptr_EvaluationFunction = (_func_int **)&PTR__EvaluationFunction_0012fc70;
  local_68 = &this->Z;
  (this->Z).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Z).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Z).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar3 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_78 = volumes;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x4b0);
  pdVar8 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 0x96;
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdVar8;
  memset(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x4b0);
  local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar8;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->voxel_dose,(long)pVVar4 - (long)pVVar3 >> 6,&local_60,&local_79);
  pvVar6 = local_78;
  local_38 = collimator;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->volumes = pvVar6;
  __n = (long)(pvVar6->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar6->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
              super__Vector_impl_data._M_start >> 6;
  this->nb_organs = (int)__n;
  local_48 = &this->nb_voxels;
  local_40 = &this->voxel_dose;
  std::vector<int,_std::allocator<int>_>::vector(local_48,__n,(allocator_type *)&local_60);
  p_Var1 = &(this->voxels)._M_t._M_impl.super__Rb_tree_header;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->F = 0.0;
  this->prev_F = 0.0;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->voxels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->beamlet_impact)._M_h._M_buckets = &(this->beamlet_impact)._M_h._M_single_bucket;
  (this->beamlet_impact)._M_h._M_bucket_count = 1;
  (this->beamlet_impact)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->beamlet_impact)._M_h._M_element_count = 0;
  (this->beamlet_impact)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->beamlet_impact)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->beamlet_impact)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->voxel2beamlet_list)._M_h._M_buckets = &(this->voxel2beamlet_list)._M_h._M_single_bucket;
  (this->voxel2beamlet_list)._M_h._M_bucket_count = 1;
  (this->voxel2beamlet_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->voxel2beamlet_list)._M_h._M_element_count = 0;
  (this->voxel2beamlet_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->voxel2beamlet_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->voxel2beamlet_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->beamlet2voxel_list)._M_h._M_buckets = &(this->beamlet2voxel_list)._M_h._M_single_bucket;
  (this->beamlet2voxel_list)._M_h._M_bucket_count = 1;
  (this->beamlet2voxel_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->beamlet2voxel_list)._M_h._M_element_count = 0;
  (this->beamlet2voxel_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70 = &this->D;
  (this->D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->D).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beamlet2voxel_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->beamlet2voxel_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->Z_diff;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->Z_diff;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  this->n_volumes =
       (int)((ulong)((long)(pvVar6->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar6->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < this->nb_organs) {
    lVar7 = 0xe;
    lVar9 = 0;
    do {
      iVar2 = *(int *)((long)&((local_78->
                               super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>).
                               _M_impl.super__Vector_impl_data._M_start)->collimator + lVar7 * 4);
      (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9] = iVar2;
      cVar5._M_current =
           (this->Z).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_60,(long)iVar2,(allocator_type *)&local_79);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::_M_insert_rval(local_68,cVar5,&local_60);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cVar5._M_current =
           (this->D).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_60,
                 (long)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9],(allocator_type *)&local_79);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::_M_insert_rval(local_70,cVar5,&local_60);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar9 < this->nb_organs);
  }
  create_voxel2beamlet_list(this,local_78,local_38);
  return;
}

Assistant:

EvaluationFunction::EvaluationFunction(vector<Volume>& volumes, const Collimator& collimator) : prev_F(0.0), F(0.0),
	volumes(volumes), nb_organs(volumes.size()), nb_voxels(volumes.size()), voxel_dose(volumes.size(), vector<double>(150)) {
  n_volumes =volumes.size();
	for(int i=0; i<nb_organs; i++){
		nb_voxels[i]=volumes[i].getNbVoxels();
		Z.insert(Z.end(), vector<double>(nb_voxels[i]));
		D.insert(D.end(), vector<double>(nb_voxels[i]));
	}

	create_voxel2beamlet_list(volumes, collimator);

}